

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O2

void nni_listener_bump_error(nni_listener *l,int err)

{
  long lVar1;
  
  switch(err) {
  case 0xd:
    lVar1 = 0x758;
    break;
  case 0x12:
  case 0x13:
    lVar1 = 0x658;
    break;
  case 0x14:
    lVar1 = 0x698;
    break;
  case 0x1a:
  case 0x1b:
    lVar1 = 0x798;
    break;
  default:
    if (err == 2) {
      lVar1 = 0x7d8;
      break;
    }
    if (err == 5) {
      lVar1 = 0x718;
      break;
    }
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
    lVar1 = 0x6d8;
  }
  nni_stat_inc((nni_stat_item *)((long)&(l->l_ops).l_size + lVar1),1);
  return;
}

Assistant:

void
nni_listener_bump_error(nni_listener *l, int err)
{
#ifdef NNG_ENABLE_STATS
	switch (err) {
	case NNG_ECONNABORTED:
	case NNG_ECONNRESET:
		nni_stat_inc(&l->st_disconnect, 1);
		break;
	case NNG_ECANCELED:
		nni_stat_inc(&l->st_canceled, 1);
		break;
	case NNG_ETIMEDOUT:
		nni_stat_inc(&l->st_timeout, 1);
		break;
	case NNG_EPROTO:
		nni_stat_inc(&l->st_proto, 1);
		break;
	case NNG_EPEERAUTH:
	case NNG_ECRYPTO:
		nni_stat_inc(&l->st_auth, 1);
		break;
	case NNG_ENOMEM:
		nni_stat_inc(&l->st_oom, 1);
		break;
	default:
		nni_stat_inc(&l->st_other, 1);
		break;
	}
#else
	NNI_ARG_UNUSED(l);
	NNI_ARG_UNUSED(err);
#endif
}